

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O3

void __thiscall UdpSocket::Implementation::Implementation(Implementation *this)

{
  int iVar1;
  runtime_error *this_00;
  
  this->isBound_ = false;
  this->isConnected_ = false;
  this->socket_ = -1;
  iVar1 = socket(2,2,0);
  this->socket_ = iVar1;
  if (iVar1 != -1) {
    (this->sendToAddr_).sin_family = 0;
    (this->sendToAddr_).sin_port = 0;
    (this->sendToAddr_).sin_addr = 0;
    (this->sendToAddr_).sin_zero[0] = '\0';
    (this->sendToAddr_).sin_zero[1] = '\0';
    (this->sendToAddr_).sin_zero[2] = '\0';
    (this->sendToAddr_).sin_zero[3] = '\0';
    (this->sendToAddr_).sin_zero[4] = '\0';
    (this->sendToAddr_).sin_zero[5] = '\0';
    (this->sendToAddr_).sin_zero[6] = '\0';
    (this->sendToAddr_).sin_zero[7] = '\0';
    (this->sendToAddr_).sin_family = 2;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"unable to create udp socket\n");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Implementation()
		: isBound_( false )
		, isConnected_( false )
		, socket_( -1 )
	{
		if( (socket_ = socket( AF_INET, SOCK_DGRAM, 0 )) == -1 ){
            throw std::runtime_error("unable to create udp socket\n");
        }

		std::memset( &sendToAddr_, 0, sizeof(sendToAddr_) );
        sendToAddr_.sin_family = AF_INET;
	}